

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Status __thiscall leveldb::VersionSet::Recover(VersionSet *this,bool *save_manifest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Env *env;
  VersionSet *this_00;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  Version *v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer in_RDX;
  bool bVar8;
  ulong uVar9;
  bool bVar10;
  VersionSet *this_01;
  bool bVar11;
  Status s;
  SequentialFile *file;
  string scratch;
  string current;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string dscname;
  Slice record;
  LogReporter reporter;
  VersionEdit edit;
  Reader reader;
  Builder builder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  VersionSet *local_3d0;
  VersionSet *local_3c8;
  pointer local_3c0;
  ulong local_3b8;
  uint64_t local_3b0;
  uint64_t local_3a8;
  SequentialFile *local_3a0;
  string local_398;
  string local_378;
  undefined1 local_358 [48];
  uint64_t local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  pointer local_310;
  Slice local_308;
  Slice local_2f8;
  Reporter local_2e8;
  _Base_ptr local_2e0;
  VersionEdit local_2d8;
  Slice local_230;
  Reader local_220;
  undefined1 local_1c8 [408];
  
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  local_378._M_string_length = 0;
  local_378.field_2._M_local_buf[0] = '\0';
  env = *(Env **)save_manifest;
  local_310 = in_RDX;
  CurrentFileName((string *)local_1c8,(string *)(save_manifest + 8));
  ReadFileToString((leveldb *)&local_3d8,env,(string *)local_1c8,&local_378);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1c8 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != paVar1) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if (local_3d8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    this->env_ = (Env *)local_3d8;
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    goto LAB_001197fd;
  }
  if ((local_378._M_string_length == 0) ||
     (local_378._M_dataplus._M_p[local_378._M_string_length - 1] != '\n')) {
    local_1c8._0_8_ = "CURRENT file does not end with newline";
    local_1c8._8_8_ = (Version *)0x26;
    local_2d8.comparator_._M_dataplus._M_p = "";
    local_2d8.comparator_._M_string_length = 0;
    Status::Status((Status *)this,kCorruption,(Slice *)local_1c8,(Slice *)&local_2d8);
    goto LAB_001197fd;
  }
  std::__cxx11::string::resize((ulong)&local_378,(char)local_378._M_string_length + -1);
  local_1c8._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,*(long *)(save_manifest + 8),
             *(long *)(save_manifest + 0x10) + *(long *)(save_manifest + 8));
  std::__cxx11::string::append(local_1c8);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_1c8,(ulong)local_378._M_dataplus._M_p);
  local_358._40_8_ = &local_320;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar7) {
    local_320._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_320._8_8_ = plVar6[3];
  }
  else {
    local_320._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_358._40_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar6;
  }
  local_328 = plVar6[1];
  *plVar6 = (long)paVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != paVar1) {
    operator_delete((void *)local_1c8._0_8_);
  }
  (**(code **)(**(long **)save_manifest + 0x10))
            (local_1c8,*(long **)save_manifest,local_358 + 0x28,&local_3a0);
  paVar7 = local_3d8;
  local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_;
  local_1c8._0_8_ = paVar7;
  if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    operator_delete__(paVar7);
  }
  if (local_3d8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    Builder::Builder((Builder *)local_1c8,(VersionSet *)save_manifest,
                     *(Version **)(save_manifest + 0x168));
    local_2e8._vptr_Reporter = (_func_int **)&PTR__Reporter_0013c108;
    local_3d0 = this;
    local_3c8 = (VersionSet *)save_manifest;
    local_2e0 = (_Base_ptr)&local_3d8;
    log::Reader::Reader(&local_220,local_3a0,&local_2e8,true,0);
    local_2f8.data_ = "";
    bVar4 = false;
    local_2f8.size_ = 0;
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    local_398._M_string_length = 0;
    local_398.field_2._M_local_buf[0] = '\0';
    bVar11 = false;
    bVar10 = false;
    bVar8 = false;
    local_3a8 = 0;
    local_3b0 = 0;
    local_3c0 = (pointer)0x0;
    local_3b8 = 0;
    while (bVar3 = log::Reader::ReadRecord(&local_220,&local_2f8,&local_398),
          bVar3 && local_3d8 ==
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) {
      VersionEdit::VersionEdit(&local_2d8);
      VersionEdit::DecodeFrom((VersionEdit *)local_358,(Slice *)&local_2d8);
      paVar1 = local_3d8;
      local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._0_8_;
      local_358._0_8_ = paVar1;
      if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        operator_delete__(paVar1);
      }
      if ((local_3d8 ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) && (local_2d8.has_comparator_ == true)) {
        (*((local_3c8->icmp_).user_comparator_)->_vptr_Comparator[3])();
        iVar5 = std::__cxx11::string::compare((char *)&local_2d8);
        if (iVar5 != 0) {
          local_358._0_8_ = local_358 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_358,local_2d8.comparator_._M_dataplus._M_p,
                     local_2d8.comparator_._M_dataplus._M_p + local_2d8.comparator_._M_string_length
                    );
          std::__cxx11::string::append((char *)local_358);
          local_230.data_._0_4_ = local_358._0_4_;
          local_230.data_._4_4_ = local_358._4_4_;
          local_230.size_._0_4_ = local_358._8_4_;
          local_230.size_._4_4_ = local_358._12_4_;
          iVar5 = (*((local_3c8->icmp_).user_comparator_)->_vptr_Comparator[3])();
          local_308.data_ = (char *)CONCAT44(extraout_var,iVar5);
          local_308.size_ = strlen(local_308.data_);
          Status::Status((Status *)(local_358 + 0x20),kInvalidArgument,&local_230,&local_308);
          paVar1 = local_3d8;
          local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._32_8_;
          local_358._32_8_ = paVar1;
          if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
            operator_delete__(paVar1);
          }
          if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
            operator_delete((void *)local_358._0_8_);
          }
        }
      }
      if (local_3d8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        Builder::Apply((Builder *)local_1c8,&local_2d8);
      }
      if (local_2d8.has_log_number_ != false) {
        bVar4 = true;
        local_3c0 = (pointer)local_2d8.log_number_;
      }
      if (local_2d8.has_prev_log_number_ != false) {
        bVar11 = true;
        local_3b8 = local_2d8.prev_log_number_;
      }
      if (local_2d8.has_next_file_number_ != false) {
        bVar10 = true;
        local_3a8 = local_2d8.next_file_number_;
      }
      if (local_2d8.has_last_sequence_ != false) {
        bVar8 = true;
        local_3b0 = local_2d8.last_sequence_;
      }
      VersionEdit::~VersionEdit(&local_2d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    log::Reader::~Reader(&local_220);
    log::Reader::Reporter::~Reporter(&local_2e8);
    if (local_3a0 != (SequentialFile *)0x0) {
      (*local_3a0->_vptr_SequentialFile[1])();
    }
    this = local_3d0;
    local_3a0 = (SequentialFile *)0x0;
    uVar9 = local_3b8;
    if (local_3d8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (bVar10) {
        if (!bVar4) {
          local_2d8.comparator_._M_dataplus._M_p = "no meta-lognumber entry in descriptor";
          local_2d8.comparator_._M_string_length = 0x25;
          local_220.file_ = (SequentialFile *)0x1287c3;
          local_220.reporter_ = (Reporter *)0x0;
          Status::Status((Status *)&local_398,kCorruption,(Slice *)&local_2d8,(Slice *)&local_220);
          _Var2._M_p = local_398._M_dataplus._M_p;
          local_398._M_dataplus._M_p = (pointer)local_3d8;
          this = local_3d0;
          goto joined_r0x001196bb;
        }
        if (!bVar8) {
          local_2d8.comparator_._M_dataplus._M_p = "no last-sequence-number entry in descriptor";
          local_2d8.comparator_._M_string_length = 0x2b;
          local_220.file_ = (SequentialFile *)0x1287c3;
          local_220.reporter_ = (Reporter *)0x0;
          Status::Status((Status *)&local_398,kCorruption,(Slice *)&local_2d8,(Slice *)&local_220);
          _Var2._M_p = local_398._M_dataplus._M_p;
          local_398._M_dataplus._M_p = (pointer)local_3d8;
          goto joined_r0x001196bb;
        }
      }
      else {
        local_2d8.comparator_._M_dataplus._M_p = "no meta-nextfile entry in descriptor";
        local_2d8.comparator_._M_string_length = 0x24;
        local_220.file_ = (SequentialFile *)0x1287c3;
        local_220.reporter_ = (Reporter *)0x0;
        Status::Status((Status *)&local_398,kCorruption,(Slice *)&local_2d8,(Slice *)&local_220);
        _Var2._M_p = local_398._M_dataplus._M_p;
        local_398._M_dataplus._M_p = (pointer)local_3d8;
        this = local_3d0;
joined_r0x001196bb:
        local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var2._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete__(local_398._M_dataplus._M_p);
        }
      }
      uVar9 = 0;
      if (bVar11) {
        uVar9 = local_3b8;
      }
      if (local_3c8->next_file_number_ <= uVar9) {
        local_3c8->next_file_number_ = uVar9 + 1;
      }
      if ((pointer)local_3c8->next_file_number_ <= local_3c0) {
        local_3c8->next_file_number_ = (uint64_t)((long)&local_3c0->first + 1);
      }
    }
    if (local_3d8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      v = (Version *)operator_new(0xe8);
      this_00 = local_3c8;
      v->vset_ = local_3c8;
      v->next_ = v;
      v->prev_ = v;
      v->refs_ = 0;
      memset(v->files_,0,0xb0);
      v->file_to_compact_level_ = -1;
      v->compaction_score_ = -1.0;
      v->compaction_level_ = -1;
      this_01 = (VersionSet *)local_1c8;
      Builder::SaveTo((Builder *)this_01,v);
      Finalize(this_01,v);
      AppendVersion(this_00,v);
      this_00->manifest_file_number_ = local_3a8;
      this_00->next_file_number_ = local_3a8 + 1;
      this_00->last_sequence_ = local_3b0;
      this_00->log_number_ = (uint64_t)local_3c0;
      this_00->prev_log_number_ = uVar9;
      bVar4 = ReuseManifest(this_00,(string *)(local_358 + 0x28),&local_378);
      if (!bVar4) {
        *(undefined1 *)&local_310->first = 1;
      }
    }
    this->env_ = (Env *)local_3d8;
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    Builder::~Builder((Builder *)local_1c8);
  }
  else if (local_3d8->_M_local_buf[4] == '\x01') {
    local_2d8.comparator_._M_dataplus._M_p = "CURRENT points to a non-existent file";
    local_2d8.comparator_._M_string_length = 0x25;
    Status::ToString_abi_cxx11_((string *)local_1c8,(Status *)&local_3d8);
    local_220.file_ = (SequentialFile *)local_1c8._0_8_;
    local_220.reporter_ = (Reporter *)local_1c8._8_8_;
    Status::Status((Status *)this,kCorruption,(Slice *)&local_2d8,(Slice *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != paVar1) {
      operator_delete((void *)local_1c8._0_8_);
    }
  }
  else {
    this->env_ = (Env *)local_3d8;
    local_3d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._40_8_ != &local_320) {
    operator_delete((void *)local_358._40_8_);
  }
LAB_001197fd:
  if (local_3d8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_3d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::Recover(bool* save_manifest) {
  struct LogReporter : public log::Reader::Reporter {
    Status* status;
    void Corruption(size_t bytes, const Status& s) override {
      if (this->status->ok()) *this->status = s;
    }
  };

  // Read "CURRENT" file, which contains a pointer to the current manifest file
  std::string current;
  Status s = ReadFileToString(env_, CurrentFileName(dbname_), &current);
  if (!s.ok()) {
    return s;
  }
  if (current.empty() || current[current.size() - 1] != '\n') {
    return Status::Corruption("CURRENT file does not end with newline");
  }
  current.resize(current.size() - 1);

  std::string dscname = dbname_ + "/" + current;
  SequentialFile* file;
  s = env_->NewSequentialFile(dscname, &file);
  if (!s.ok()) {
    if (s.IsNotFound()) {
      return Status::Corruption("CURRENT points to a non-existent file",
                                s.ToString());
    }
    return s;
  }

  bool have_log_number = false;
  bool have_prev_log_number = false;
  bool have_next_file = false;
  bool have_last_sequence = false;
  uint64_t next_file = 0;
  uint64_t last_sequence = 0;
  uint64_t log_number = 0;
  uint64_t prev_log_number = 0;
  Builder builder(this, current_);

  {
    LogReporter reporter;
    reporter.status = &s;
    log::Reader reader(file, &reporter, true /*checksum*/,
                       0 /*initial_offset*/);
    Slice record;
    std::string scratch;
    while (reader.ReadRecord(&record, &scratch) && s.ok()) {
      VersionEdit edit;
      s = edit.DecodeFrom(record);
      if (s.ok()) {
        if (edit.has_comparator_ &&
            edit.comparator_ != icmp_.user_comparator()->Name()) {
          s = Status::InvalidArgument(
              edit.comparator_ + " does not match existing comparator ",
              icmp_.user_comparator()->Name());
        }
      }

      if (s.ok()) {
        builder.Apply(&edit);
      }

      if (edit.has_log_number_) {
        log_number = edit.log_number_;
        have_log_number = true;
      }

      if (edit.has_prev_log_number_) {
        prev_log_number = edit.prev_log_number_;
        have_prev_log_number = true;
      }

      if (edit.has_next_file_number_) {
        next_file = edit.next_file_number_;
        have_next_file = true;
      }

      if (edit.has_last_sequence_) {
        last_sequence = edit.last_sequence_;
        have_last_sequence = true;
      }
    }
  }
  delete file;
  file = nullptr;

  if (s.ok()) {
    if (!have_next_file) {
      s = Status::Corruption("no meta-nextfile entry in descriptor");
    } else if (!have_log_number) {
      s = Status::Corruption("no meta-lognumber entry in descriptor");
    } else if (!have_last_sequence) {
      s = Status::Corruption("no last-sequence-number entry in descriptor");
    }

    if (!have_prev_log_number) {
      prev_log_number = 0;
    }

    MarkFileNumberUsed(prev_log_number);
    MarkFileNumberUsed(log_number);
  }

  if (s.ok()) {
    Version* v = new Version(this);
    builder.SaveTo(v);
    // Install recovered version
    Finalize(v);
    AppendVersion(v);
    manifest_file_number_ = next_file;
    next_file_number_ = next_file + 1;
    last_sequence_ = last_sequence;
    log_number_ = log_number;
    prev_log_number_ = prev_log_number;

    // See if we can reuse the existing MANIFEST file.
    if (ReuseManifest(dscname, current)) {
      // No need to save new manifest
    } else {
      *save_manifest = true;
    }
  }

  return s;
}